

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WithQueensAsTrump.h
# Opt level: O2

void __thiscall WithQueensAsTrump::WithQueensAsTrump(WithQueensAsTrump *this)

{
  initializer_list<Card> __l;
  allocator_type local_51;
  _Vector_base<Card,_std::allocator<Card>_> local_50;
  Card local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_DifferentTrumpRule).super_Rule._vptr_Rule = (_func_int **)&PTR_isTrump_0010ecd0;
  local_38.m_suit = DIAMONDS;
  local_38.m_value = QUEEN;
  uStack_30 = 0x200000001;
  local_28 = 0x200000002;
  uStack_20 = 0x200000003;
  __l._M_len = 4;
  __l._M_array = &local_38;
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&local_50,__l,&local_51);
  std::vector<Card,_std::allocator<Card>_>::_M_move_assign
            (&(this->super_DifferentTrumpRule).m_trumpCards,&local_50);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

WithQueensAsTrump() {
        m_trumpCards = std::vector<Card>{
                Card(Suit::DIAMONDS, CardValue::QUEEN),
                Card(Suit::HEARTS, CardValue::QUEEN),
                Card(Suit::SPADES, CardValue::QUEEN),
                Card(Suit::CLUBS, CardValue::QUEEN),
                };
    }